

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O2

bool FIX::Session::sendToTarget(Message *message,SessionID *sessionID)

{
  Session *this;
  ssize_t sVar1;
  SessionNotFound *this_00;
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  allocator<char> local_39;
  string local_38;
  
  Message::setSessionID(message,sessionID);
  this = lookupSession(sessionID);
  if (this != (Session *)0x0) {
    sVar1 = send(this,(int)message,__buf,in_RCX,in_R8D);
    return SUB81(sVar1,0);
  }
  this_00 = (SessionNotFound *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  SessionNotFound::SessionNotFound(this_00,&local_38);
  __cxa_throw(this_00,&SessionNotFound::typeinfo,Exception::~Exception);
}

Assistant:

bool Session::sendToTarget( Message& message, const SessionID& sessionID )
EXCEPT ( SessionNotFound )
{
  message.setSessionID( sessionID );
  Session* pSession = lookupSession( sessionID );
  if ( !pSession ) throw SessionNotFound();
  return pSession->send( message );
}